

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O2

void * X509V3_get_d2i(stack_st_X509_EXTENSION *x,int nid,int *crit,int *idx)

{
  int iVar1;
  X509_EXTENSION *pXVar2;
  void *pvVar3;
  X509_EXTENSION *ex;
  uint uVar4;
  X509_EXTENSION *i;
  bool bVar5;
  
  if (x == (stack_st_X509_EXTENSION *)0x0) {
    if (idx != (int *)0x0) {
      *idx = -1;
    }
    if (crit != (int *)0x0) {
      *crit = -1;
    }
  }
  else {
    ex = (X509_EXTENSION *)0x0;
    uVar4 = 0;
    if (idx != (int *)0x0) {
      uVar4 = *idx + 1;
    }
    i = (X509_EXTENSION *)(ulong)uVar4;
    if ((int)uVar4 < 1) {
      i = ex;
    }
    for (; pXVar2 = (X509_EXTENSION *)OPENSSL_sk_num((OPENSSL_STACK *)x), i < pXVar2;
        i = (X509_EXTENSION *)((long)&i->object + 1)) {
      pXVar2 = (X509_EXTENSION *)OPENSSL_sk_value((OPENSSL_STACK *)x,(size_t)i);
      iVar1 = OBJ_obj2nid(pXVar2->object);
      if (iVar1 == nid) {
        if (idx != (int *)0x0) {
          *idx = (int)i;
          ex = pXVar2;
          goto LAB_0020da3f;
        }
        bVar5 = ex != (X509_EXTENSION *)0x0;
        ex = pXVar2;
        if (bVar5) {
          if (crit == (int *)0x0) {
            return (void *)0x0;
          }
          *crit = -2;
          return (void *)0x0;
        }
      }
    }
    if (ex != (X509_EXTENSION *)0x0) {
LAB_0020da3f:
      if (crit != (int *)0x0) {
        iVar1 = X509_EXTENSION_get_critical(ex);
        *crit = iVar1;
      }
      pvVar3 = X509V3_EXT_d2i(ex);
      return pvVar3;
    }
    if (idx != (int *)0x0) {
      *idx = -1;
    }
    if (crit != (int *)0x0) {
      *crit = -1;
    }
  }
  return (void *)0x0;
}

Assistant:

void *X509V3_get_d2i(const STACK_OF(X509_EXTENSION) *extensions, int nid,
                     int *out_critical, int *out_idx) {
  int lastpos;
  X509_EXTENSION *ex, *found_ex = NULL;
  if (!extensions) {
    if (out_idx) {
      *out_idx = -1;
    }
    if (out_critical) {
      *out_critical = -1;
    }
    return NULL;
  }
  if (out_idx) {
    lastpos = *out_idx + 1;
  } else {
    lastpos = 0;
  }
  if (lastpos < 0) {
    lastpos = 0;
  }
  for (size_t i = lastpos; i < sk_X509_EXTENSION_num(extensions); i++) {
    ex = sk_X509_EXTENSION_value(extensions, i);
    if (OBJ_obj2nid(ex->object) == nid) {
      if (out_idx) {
        // TODO(https://crbug.com/boringssl/379): Consistently reject
        // duplicate extensions.
        *out_idx = (int)i;
        found_ex = ex;
        break;
      } else if (found_ex) {
        // Found more than one
        if (out_critical) {
          *out_critical = -2;
        }
        return NULL;
      }
      found_ex = ex;
    }
  }
  if (found_ex) {
    // Found it
    if (out_critical) {
      *out_critical = X509_EXTENSION_get_critical(found_ex);
    }
    return X509V3_EXT_d2i(found_ex);
  }

  // Extension not found
  if (out_idx) {
    *out_idx = -1;
  }
  if (out_critical) {
    *out_critical = -1;
  }
  return NULL;
}